

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

UBool __thiscall
icu_63::TailoredSet::handleCE32(TailoredSet *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  CollationData *this_00;
  UBool UVar1;
  uint32_t uVar2;
  uint32_t local_24;
  uint32_t baseCE32;
  uint32_t ce32_local;
  UChar32 end_local;
  UChar32 start_local;
  TailoredSet *this_local;
  
  UVar1 = Collation::isSpecialCE32(ce32);
  ce32_local = start;
  local_24 = ce32;
  if ((UVar1 == '\0') ||
     (local_24 = CollationData::getIndirectCE32(this->data,ce32), local_24 != 0xc0)) {
    do {
      this_00 = this->baseData;
      uVar2 = CollationData::getCE32(this->baseData,ce32_local);
      uVar2 = CollationData::getFinalCE32(this_00,uVar2);
      UVar1 = Collation::isSelfContainedCE32(local_24);
      if ((UVar1 == '\0') || (UVar1 = Collation::isSelfContainedCE32(uVar2), UVar1 == '\0')) {
        compare(this,ce32_local,local_24,uVar2);
      }
      else if (local_24 != uVar2) {
        UnicodeSet::add(this->tailored,ce32_local);
      }
      ce32_local = ce32_local + 1;
    } while ((int)ce32_local <= end);
    this_local._7_1_ = ::U_SUCCESS(this->errorCode);
  }
  else {
    this_local._7_1_ = ::U_SUCCESS(this->errorCode);
  }
  return this_local._7_1_;
}

Assistant:

UBool
TailoredSet::handleCE32(UChar32 start, UChar32 end, uint32_t ce32) {
    U_ASSERT(ce32 != Collation::FALLBACK_CE32);
    if(Collation::isSpecialCE32(ce32)) {
        ce32 = data->getIndirectCE32(ce32);
        if(ce32 == Collation::FALLBACK_CE32) {
            return U_SUCCESS(errorCode);
        }
    }
    do {
        uint32_t baseCE32 = baseData->getFinalCE32(baseData->getCE32(start));
        // Do not just continue if ce32 == baseCE32 because
        // contractions and expansions in different data objects
        // normally differ even if they have the same data offsets.
        if(Collation::isSelfContainedCE32(ce32) && Collation::isSelfContainedCE32(baseCE32)) {
            // fastpath
            if(ce32 != baseCE32) {
                tailored->add(start);
            }
        } else {
            compare(start, ce32, baseCE32);
        }
    } while(++start <= end);
    return U_SUCCESS(errorCode);
}